

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SOIL.c
# Opt level: O3

int query_NPOT_capability(void)

{
  char *pcVar1;
  
  if (has_NPOT_capability != -1) {
    return has_NPOT_capability;
  }
  pcVar1 = (char *)glGetString(0x1f03);
  pcVar1 = strstr(pcVar1,"GL_ARB_texture_non_power_of_two");
  has_NPOT_capability = (uint)(pcVar1 != (char *)0x0);
  return (uint)(pcVar1 != (char *)0x0);
}

Assistant:

int query_NPOT_capability( void )
{
	/*	check for the capability	*/
	if( has_NPOT_capability == SOIL_CAPABILITY_UNKNOWN )
	{
		/*	we haven't yet checked for the capability, do so	*/
		if(
			(NULL == strstr( (char const*)glGetString( GL_EXTENSIONS ),
				"GL_ARB_texture_non_power_of_two" ) )
			)
		{
			/*	not there, flag the failure	*/
			has_NPOT_capability = SOIL_CAPABILITY_NONE;
		} else
		{
			/*	it's there!	*/
			has_NPOT_capability = SOIL_CAPABILITY_PRESENT;
		}
	}
	/*	let the user know if we can do non-power-of-two textures or not	*/
	return has_NPOT_capability;
}